

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  container_t *c1_00;
  container_t *c2_00;
  container_t *local_60;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t local_30;
  ushort local_2e;
  uint8_t result_type;
  uint8_t type2;
  int32_t iStack_2c;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int length2;
  int length1;
  int intersection_size;
  int pos2;
  int pos1;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  if (x1 != x2) {
    intersection_size = 0;
    length1 = 0;
    length2 = 0;
    _pos2 = &x2->high_low_container;
    x2_local = x1;
    _s2 = ra_get_size(&x1->high_low_container);
    iStack_2c = ra_get_size(_pos2);
    while (intersection_size < _s2 && length1 < iStack_2c) {
      local_2e = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)intersection_size);
      local_30 = ra_get_key_at_index(_pos2,(uint16_t)length1);
      if (local_2e == local_30) {
        c1_00 = ra_get_container_at_index
                          (&x2_local->high_low_container,(uint16_t)intersection_size,
                           (uint8_t *)((long)&c1 + 7));
        c2_00 = ra_get_container_at_index(_pos2,(uint16_t)length1,(uint8_t *)((long)&c1 + 6));
        if (c1._7_1_ == '\x04') {
          local_60 = container_and(c1_00,'\x04',c2_00,c1._6_1_,(uint8_t *)((long)&c1 + 5));
        }
        else {
          local_60 = container_iand(c1_00,c1._7_1_,c2_00,c1._6_1_,(uint8_t *)((long)&c1 + 5));
        }
        if (local_60 != c1_00) {
          container_free(c1_00,c1._7_1_);
        }
        _Var1 = container_nonzero_cardinality(local_60,c1._5_1_);
        if (_Var1) {
          ra_replace_key_and_container_at_index
                    (&x2_local->high_low_container,length2,local_2e,local_60,c1._5_1_);
          length2 = length2 + 1;
        }
        else {
          container_free(local_60,c1._5_1_);
        }
        intersection_size = intersection_size + 1;
        length1 = length1 + 1;
      }
      else if (local_2e < local_30) {
        intersection_size =
             ra_advance_until_freeing(&x2_local->high_low_container,local_30,intersection_size);
      }
      else {
        length1 = ra_advance_until(_pos2,local_2e,length1);
      }
    }
    for (; intersection_size < _s2; intersection_size = intersection_size + 1) {
      container_free((x2_local->high_low_container).containers[intersection_size],
                     (x2_local->high_low_container).typecodes[intersection_size]);
    }
    ra_downsize(&x2_local->high_low_container,length2);
  }
  return;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}